

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O3

void api_suite::api_back(void)

{
  undefined8 local_48;
  undefined4 local_3c;
  undefined4 local_38 [4];
  undefined4 *local_28;
  long local_20;
  undefined8 local_18;
  
  local_28 = local_38;
  local_18 = 5;
  local_20 = 1;
  local_38[0] = 0xb;
  local_48 = 1;
  local_3c = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("data.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x8b,"void api_suite::api_back()",&local_48,&local_3c);
  if (local_20 != 0) {
    local_48 = CONCAT44(local_48._4_4_,0xb);
    boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
              ("data.back()","11",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
               ,0x8c,"void api_suite::api_back()",
               (ulong)(((int)local_18 - 1U & 3) << 2) + (long)local_28,&local_48);
    return;
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/include/vista/detail/circular_view.ipp"
                ,0x80,"reference vista::circular_view<int, 4>::back() [T = int, Extent = 4]");
}

Assistant:

void api_back()
{
    circular_array<int, 4> data;
    data.push_back(11);
    BOOST_TEST_EQ(data.size(), 1);
    BOOST_TEST_EQ(data.back(), 11);
}